

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int col;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar11;
  float fVar12;
  Matrix<float,_2,_3> retVal;
  Type in0;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  long lVar10;
  
  pfVar1 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pfVar4 = (float *)&in0;
    bVar11 = true;
    do {
      bVar2 = bVar11;
      lVar7 = 0;
      auVar8 = _DAT_00ada920;
      do {
        bVar11 = SUB164(auVar8 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar11) {
          fVar12 = 1.0;
          if (lVar3 != lVar7) {
            fVar12 = 0.0;
          }
          pfVar4[lVar7 * 2] = fVar12;
        }
        if (bVar11) {
          fVar12 = 1.0;
          if (lVar3 + -1 != lVar7) {
            fVar12 = 0.0;
          }
          pfVar4[lVar7 * 2 + 2] = fVar12;
        }
        lVar7 = lVar7 + 2;
        lVar10 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar10 + 2;
      } while (lVar7 != 4);
      lVar3 = 1;
      pfVar4 = pfVar1;
      bVar11 = false;
    } while (bVar2);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    lVar3 = 0;
    pfVar4 = (float *)&in0;
    bVar11 = true;
    do {
      bVar2 = bVar11;
      lVar7 = 0;
      do {
        pfVar4[lVar7 * 2] = *(float *)((long)&s_constInMat3x2 + lVar3 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar3 = 0xc;
      pfVar4 = pfVar1;
      bVar11 = false;
    } while (bVar2);
  }
  pfVar4 = retVal.m_data.m_data[0].m_data + 1;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  lVar3 = 0;
  pfVar5 = (float *)&retVal;
  bVar11 = true;
  do {
    bVar2 = bVar11;
    lVar7 = 0;
    auVar9 = _DAT_00ada920;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_00ad8f80,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
      if (bVar11) {
        fVar12 = 1.0;
        if (lVar3 != lVar7) {
          fVar12 = 0.0;
        }
        pfVar5[lVar7 * 2] = fVar12;
      }
      if (bVar11) {
        fVar12 = 1.0;
        if (lVar3 + -1 != lVar7) {
          fVar12 = 0.0;
        }
        pfVar5[lVar7 * 2 + 2] = fVar12;
      }
      lVar7 = lVar7 + 2;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while (lVar7 != 4);
    lVar3 = 1;
    pfVar5 = pfVar4;
    bVar11 = false;
  } while (bVar2);
  pfVar5 = (float *)&retVal;
  pfVar6 = (float *)&in0;
  bVar11 = true;
  do {
    bVar2 = bVar11;
    lVar3 = 0;
    do {
      pfVar5[lVar3 * 2] = (float)((uint)pfVar6[lVar3 * 2] ^ (uint)DAT_00ad8f80);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pfVar5 = pfVar4;
    pfVar6 = pfVar1;
    bVar11 = false;
  } while (bVar2);
  local_28 = CONCAT44(retVal.m_data.m_data[1].m_data[1] + retVal.m_data.m_data[1].m_data[0],
                      retVal.m_data.m_data[0].m_data[0] + retVal.m_data.m_data[0].m_data[1]);
  local_20 = retVal.m_data.m_data[2].m_data[0] + retVal.m_data.m_data[2].m_data[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = afStack_30[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}